

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# llb4Image.c
# Opt level: O2

int Llb_Nonlin4Quantify1(Llb_Mgr_t_conflict *p,Llb_Prt_t *pPart)

{
  DdNode *f;
  Vec_Int_t *p_00;
  Llb_Var_t *pVar;
  int iVar1;
  int iVar2;
  DdNode *n;
  DdNode *n_00;
  Vec_Ptr_t *p_01;
  Llb_Prt_t *pPart_00;
  int iVar3;
  long lVar4;
  
  n = Llb_Nonlin4CreateCube1(p,pPart);
  Cudd_Ref(n);
  f = pPart->bFunc;
  n_00 = Cudd_bddExistAbstract(p->dd,f,n);
  pPart->bFunc = n_00;
  Cudd_Ref(n_00);
  Cudd_RecursiveDeref(p->dd,f);
  Cudd_RecursiveDeref(p->dd,n);
  iVar3 = 0;
  p_01 = Vec_PtrAlloc(0);
  iVar1 = Cudd_DagSize(pPart->bFunc);
  Extra_SupportArray(p->dd,pPart->bFunc,p->pSupp);
  do {
    p_00 = pPart->vVars;
    if (p_00->nSize <= iVar3) {
      pPart->nSize = iVar1;
      p_00->nSize = 0;
      for (lVar4 = 0; lVar4 < p->nVars; lVar4 = lVar4 + 1) {
        if (p->pSupp[lVar4] != 0) {
          iVar1 = Vec_IntEntry(p->vVars2Q,(int)lVar4);
          if (iVar1 != 0) {
            Vec_IntPush(pPart->vVars,(int)lVar4);
          }
        }
      }
      iVar1 = p_01->nSize;
      iVar3 = 0;
      if (iVar1 < 1) {
        iVar1 = 0;
        iVar3 = 0;
      }
      for (; iVar1 != iVar3; iVar3 = iVar3 + 1) {
        pPart_00 = (Llb_Prt_t *)Vec_PtrEntry(p_01,iVar3);
        Llb_Nonlin4Quantify1(p,pPart_00);
      }
      Vec_PtrFree(p_01);
      return 0;
    }
    iVar2 = Vec_IntEntry(p_00,iVar3);
    pVar = p->pVars[iVar2];
    if (p->pSupp[pVar->iVar] == 0) {
      iVar2 = Vec_IntRemove(pVar->vParts,pPart->iPart);
      if (iVar2 == 0) {
        __assert_fail("RetValue",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/bdd/llb/llb4Image.c"
                      ,0x120,"int Llb_Nonlin4Quantify1(Llb_Mgr_t *, Llb_Prt_t *)");
      }
      pVar->nScore = pVar->nScore - pPart->nSize;
      iVar2 = pVar->vParts->nSize;
      if (iVar2 == 1) {
        iVar2 = Vec_IntEntry(pVar->vParts,0);
        Vec_PtrPushUnique(p_01,p->pParts[iVar2]);
      }
      else if (iVar2 == 0) {
        Llb_Nonlin4RemoveVar(p,pVar);
      }
    }
    else {
      if (pVar->vParts->nSize < 2) {
        __assert_fail("Vec_IntSize(pVar->vParts) > 1",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/bdd/llb/llb4Image.c"
                      ,0x11a,"int Llb_Nonlin4Quantify1(Llb_Mgr_t *, Llb_Prt_t *)");
      }
      pVar->nScore = pVar->nScore + (iVar1 - pPart->nSize);
    }
    iVar3 = iVar3 + 1;
  } while( true );
}

Assistant:

int Llb_Nonlin4Quantify1( Llb_Mgr_t * p, Llb_Prt_t * pPart )
{
    Llb_Var_t * pVar;
    Llb_Prt_t * pTemp;
    Vec_Ptr_t * vSingles;
    DdNode * bCube, * bTemp;
    int i, RetValue, nSizeNew;
    // create cube to be quantified
    bCube = Llb_Nonlin4CreateCube1( p, pPart );   Cudd_Ref( bCube );
//    assert( !Cudd_IsConstant(bCube) );
    // derive new function
    pPart->bFunc = Cudd_bddExistAbstract( p->dd, bTemp = pPart->bFunc, bCube );  Cudd_Ref( pPart->bFunc );
    Cudd_RecursiveDeref( p->dd, bTemp );
    Cudd_RecursiveDeref( p->dd, bCube );
    // get support
    vSingles = Vec_PtrAlloc( 0 );
    nSizeNew = Cudd_DagSize(pPart->bFunc);
    Extra_SupportArray( p->dd, pPart->bFunc, p->pSupp );
    Llb_PartForEachVar( p, pPart, pVar, i )
        if ( p->pSupp[pVar->iVar] )
        {
            assert( Vec_IntSize(pVar->vParts) > 1 );
            pVar->nScore -= pPart->nSize - nSizeNew;
        }
        else
        {
            RetValue = Vec_IntRemove( pVar->vParts, pPart->iPart );
            assert( RetValue );
            pVar->nScore -= pPart->nSize;
            if ( Vec_IntSize(pVar->vParts) == 0 )
                Llb_Nonlin4RemoveVar( p, pVar );
            else if ( Vec_IntSize(pVar->vParts) == 1 )
                Vec_PtrPushUnique( vSingles, Llb_MgrPart(p, Vec_IntEntry(pVar->vParts,0)) );
        }

    // update partition
    pPart->nSize = nSizeNew;
    Vec_IntClear( pPart->vVars );
    for ( i = 0; i < p->nVars; i++ )
        if ( p->pSupp[i] && Vec_IntEntry(p->vVars2Q, i) )
            Vec_IntPush( pPart->vVars, i );
    // remove other variables
    Vec_PtrForEachEntry( Llb_Prt_t *, vSingles, pTemp, i )
        Llb_Nonlin4Quantify1( p, pTemp );
    Vec_PtrFree( vSingles );
    return 0;
}